

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O3

bool __thiscall
Lib::DHMap<Kernel::Literal_*,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::getValuePtr
          (DHMap<Kernel::Literal_*,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *this,
          Literal *key,uint **pval,uint *initial)

{
  uint uVar1;
  bool bVar2;
  Entry *pEVar3;
  uint uVar4;
  uint uVar5;
  Literal *local_20;
  
  local_20 = key;
  if (this->_nextExpansionOccupancy <= this->_deleted + this->_size) {
    expand(this);
  }
  pEVar3 = findEntryToInsert(this,&local_20);
  uVar5 = (uint)(pEVar3->field_0)._infoData >> 2;
  uVar1 = this->_timestamp;
  bVar2 = ((pEVar3->field_0)._infoData & 1U) != 0;
  if (bVar2 || uVar5 != uVar1) {
    if (uVar5 == uVar1) {
      this->_deleted = this->_deleted + -1;
      uVar4 = (pEVar3->field_0)._infoData & 0xfffffffe;
    }
    else {
      uVar4 = uVar1 << 2;
    }
    (pEVar3->field_0)._infoData = uVar4;
    pEVar3->_key = local_20;
    pEVar3->_val = *initial;
    this->_size = this->_size + 1;
  }
  *pval = &pEVar3->_val;
  return bVar2 || uVar5 != uVar1;
}

Assistant:

bool getValuePtr(Key key, Val*& pval, const Val& initial)
  {
    ensureExpanded();
    Entry* e=findEntryToInsert(key);
    bool exists = e->_info.timestamp==_timestamp && !e->_info.deleted;
    if(!exists) {
      if(e->_info.timestamp!=_timestamp) {
	e->_info.timestamp=_timestamp;
	//no collision has occured on this entry while this _timestamp is set
	e->_info.collision=0;
      } else {
	ASS(e->_info.deleted);
	_deleted--;
      }
      e->_info.deleted=0;
      e->_key=key;
      e->_val=initial;
      _size++;
    }
    pval=&e->_val;
    return !exists;
  }